

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O3

MPP_RET mpp_service_cmd_send(void *ctx)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  MPP_RET MVar5;
  uint uVar6;
  MppReqV1 *pMVar7;
  long lVar8;
  MPP_RET *pMVar9;
  char *pcVar10;
  long lVar11;
  MppReqV1 mpp_req;
  
  if ((*(int *)((long)ctx + 0x34) < 1) || (*(int *)((long)ctx + 0x30) < *(int *)((long)ctx + 0x34)))
  {
    _mpp_log_l(2,"mpp_serivce","ctx %p invalid request count %d\n","mpp_service_cmd_send",ctx);
    MVar5 = MPP_ERR_VALUE;
  }
  else {
    if (*(int *)((long)ctx + 0x78) != 0) {
      if (*(int *)((long)ctx + 0x188) != 0) {
        iVar4 = ioctl(*(int *)((long)ctx + 4),0x40047601);
        if (iVar4 != 0) {
          *(undefined4 *)((long)ctx + 0x188) = 0;
        }
      }
      *(undefined4 *)((long)ctx + 0x78) = 0;
    }
    if (*(int *)((long)ctx + 0x44) != 0) {
      pMVar7 = mpp_service_next_req((MppDevMppService *)ctx);
      pMVar7->cmd = 0x202;
      pMVar7->flag = 0x10;
      iVar4 = *(int *)((long)ctx + 0x44);
      pMVar7->size = iVar4 * 8;
      pMVar7->offset = 0;
      iVar2 = *(int *)((long)ctx + 0x48);
      pMVar7->data_ptr = (long)iVar2 * 8 + *(long *)((long)ctx + 0x38);
      *(int *)((long)ctx + 0x48) = iVar4 + iVar2;
    }
    if (*(int *)((long)ctx + 0x5c) != 0) {
      pMVar7 = mpp_service_next_req((MppDevMppService *)ctx);
      pMVar7->cmd = 0x203;
      pMVar7->flag = 0;
      iVar4 = *(int *)((long)ctx + 0x5c);
      pMVar7->size = iVar4 * 8;
      pMVar7->offset = 0;
      iVar2 = *(int *)((long)ctx + 0x60);
      pMVar7->data_ptr = (long)iVar2 * 8 + *(long *)((long)ctx + 0x50);
      *(int *)((long)ctx + 0x60) = iVar4 + iVar2;
    }
    lVar8 = (long)*(int *)((long)ctx + 0x34);
    lVar3 = *(long *)((long)ctx + 0x28);
    if (1 < lVar8) {
      lVar11 = 0;
      do {
        pbVar1 = (byte *)(lVar3 + 4 + lVar11);
        *pbVar1 = *pbVar1 | 1;
        lVar11 = lVar11 + 0x18;
      } while (lVar8 * 0x18 != lVar11);
    }
    pbVar1 = (byte *)(lVar3 + -0x14 + lVar8 * 0x18);
    *pbVar1 = *pbVar1 | 0x12;
    if (*(int *)((long)ctx + 0x18) == 0) {
      MVar5 = MPP_OK;
      uVar6 = ioctl(*(int *)((long)ctx + 8),0x40047601);
      if (uVar6 != 0) {
        pMVar9 = __errno_location();
        MVar5 = *pMVar9;
        pcVar10 = strerror(MVar5);
        _mpp_log_l(2,"mpp_serivce","ioctl MPP_IOC_CFG_V1 failed ret %d errno %d %s\n",
                   "mpp_service_cmd_send",(ulong)uVar6,(ulong)(uint)MVar5,pcVar10);
        MVar5 = *pMVar9;
      }
    }
    else {
      MVar5 = mpp_server_send_task(ctx);
      if (MVar5 == MPP_OK) {
        MVar5 = MPP_OK;
      }
      else {
        _mpp_log_l(2,"mpp_serivce","send task to server ret %d\n","mpp_service_cmd_send",
                   (ulong)(uint)MVar5);
      }
    }
    *(undefined4 *)((long)ctx + 0x34) = 0;
    *(undefined8 *)((long)ctx + 0x44) = 0;
    *(undefined8 *)((long)ctx + 0x5c) = 0;
  }
  return MVar5;
}

Assistant:

MPP_RET mpp_service_cmd_send(void *ctx)
{
    MPP_RET ret = MPP_OK;
    MppDevMppService *p = (MppDevMppService *)ctx;

    if (p->req_cnt <= 0 || p->req_cnt > p->req_max) {
        mpp_err_f("ctx %p invalid request count %d\n", ctx, p->req_cnt);
        return MPP_ERR_VALUE;
    }

    if (p->info_count) {
        if (p->support_set_info) {
            MppReqV1 mpp_req;

            mpp_req.cmd = MPP_CMD_SEND_CODEC_INFO;
            mpp_req.flag = MPP_FLAGS_LAST_MSG;
            mpp_req.size = p->info_count * sizeof(p->info[0]);
            mpp_req.offset = 0;
            mpp_req.data_ptr = REQ_DATA_PTR(p->info);

            ret = mpp_service_ioctl_request(p->client, &mpp_req);
            if (ret)
                p->support_set_info = 0;
        }
        p->info_count = 0;
    }

    /* set fd trans info if needed */
    if (p->reg_offset_count) {
        MppReqV1 *mpp_req = mpp_service_next_req(p);

        mpp_req->cmd = MPP_CMD_SET_REG_ADDR_OFFSET;
        mpp_req->flag = MPP_FLAGS_REG_OFFSET_ALONE;
        mpp_req->size = (p->reg_offset_count) * sizeof(RegOffsetInfo);
        mpp_req->offset = 0;
        mpp_req->data_ptr = REQ_DATA_PTR(&p->reg_offset_info[p->reg_offset_pos]);
        p->reg_offset_pos += p->reg_offset_count;
    }

    /* set rcb offst info if needed */
    if (p->rcb_count) {
        MppReqV1 *mpp_req = mpp_service_next_req(p);

        mpp_req->cmd = MPP_CMD_SET_RCB_INFO;
        mpp_req->flag = 0;
        mpp_req->size = p->rcb_count * sizeof(RcbInfo);
        mpp_req->offset = 0;
        mpp_req->data_ptr = REQ_DATA_PTR(&p->rcb_info[p->rcb_pos]);
        p->rcb_pos += p->rcb_count;
    }

    /* setup flag for multi message request */
    if (p->req_cnt > 1) {
        RK_S32 i;

        for (i = 0; i < p->req_cnt; i++)
            p->reqs[i].flag |= MPP_FLAGS_MULTI_MSG;
    }
    p->reqs[p->req_cnt - 1].flag |=  MPP_FLAGS_LAST_MSG | MPP_FLAGS_REG_OFFSET_ALONE;

    if (p->batch_io) {
        ret = mpp_server_send_task(ctx);
        if (ret)
            mpp_err_f("send task to server ret %d\n", ret);
    } else {
        ret = mpp_service_ioctl_request(p->server, &p->reqs[0]);
        if (ret) {
            mpp_err_f("ioctl MPP_IOC_CFG_V1 failed ret %d errno %d %s\n",
                      ret, errno, strerror(errno));
            ret = errno;
        }
    }

    p->req_cnt = 0;
    p->reg_offset_count = 0;
    p->reg_offset_pos = 0;
    p->rcb_count = 0;
    p->rcb_pos = 0;
    p->rcb_count = 0;
    return ret;
}